

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_independence_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::TileIndependenceLSTest::~TileIndependenceLSTest(TileIndependenceLSTest *this)

{
  anon_unknown.dwarf_cf5041::TileIndependenceTest::~TileIndependenceTest
            ((TileIndependenceTest *)(this + -0x10));
  return;
}

Assistant:

TEST_P(TileIndependenceLSTest, MD5Match) {
  cfg_.large_scale_tile = 1;
  fw_dec_->Control(AV1_SET_TILE_MODE, 1);
  fw_dec_->Control(AV1D_EXT_TILE_DEBUG, 1);
  inv_dec_->Control(AV1_SET_TILE_MODE, 1);
  inv_dec_->Control(AV1D_EXT_TILE_DEBUG, 1);
  DoTest();
}